

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  int iVar1;
  FileDescriptor *pFVar2;
  ulong uVar3;
  FileDescriptor *descriptor;
  FileDescriptor *descriptor_00;
  EnumDescriptor *extraout_RDX;
  EnumDescriptor *extraout_RDX_00;
  EnumDescriptor *extraout_RDX_01;
  EnumDescriptor *descriptor_01;
  int index;
  char *text;
  ulong uVar4;
  long lVar5;
  long lVar6;
  string base64;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,
                     "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
                     ,"file_name",*(string **)this->file_,"reflection_class_name",
                     &this->reflectionClassname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"string.Concat(\n");
  io::Printer::Indent(printer);
  FileDescriptorToBase64_abi_cxx11_(&local_50,(csharp *)this->file_,descriptor);
  if (0x3c < local_50._M_string_length) {
    do {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
      io::Printer::Print(printer,"\"$base64$\",\n","base64",&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_50);
      std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    } while (0x3c < local_50._M_string_length);
  }
  io::Printer::Print(printer,"\"$base64$\"));\n","base64",&local_50);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n")
  ;
  io::Printer::Print(printer,"    new pbr::FileDescriptor[] { ");
  pFVar2 = this->file_;
  if (0 < *(int *)(pFVar2 + 0x18)) {
    index = 0;
    do {
      pFVar2 = FileDescriptor::dependency(pFVar2,index);
      iVar1 = std::__cxx11::string::compare(*(char **)pFVar2);
      if (iVar1 == 0) {
        io::Printer::Print(printer,"pbr::FileDescriptor.DescriptorProtoFileDescriptor, ");
      }
      else {
        pFVar2 = FileDescriptor::dependency(this->file_,index);
        GetReflectionClassName_abi_cxx11_(&local_70,(csharp *)pFVar2,descriptor_00);
        io::Printer::Print(printer,"$full_reflection_class_name$.Descriptor, ",
                           "full_reflection_class_name",&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      index = index + 1;
      pFVar2 = this->file_;
    } while (index < *(int *)(pFVar2 + 0x18));
  }
  io::Printer::Print(printer,"},\n    new pbr::GeneratedClrTypeInfo(");
  if (*(int *)(this->file_ + 0x68) < 1) {
    text = "null, ";
  }
  else {
    io::Printer::Print(printer,"new[] {");
    pFVar2 = this->file_;
    text = "}, ";
    if (0 < *(int *)(pFVar2 + 0x68)) {
      lVar6 = 0;
      lVar5 = 0;
      descriptor_01 = extraout_RDX;
      do {
        GetClassName_abi_cxx11_
                  (&local_70,(csharp *)(*(long *)(pFVar2 + 0x70) + lVar6),descriptor_01);
        io::Printer::Print(printer,"typeof($type_name$), ","type_name",&local_70);
        descriptor_01 = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          descriptor_01 = extraout_RDX_01;
        }
        lVar5 = lVar5 + 1;
        pFVar2 = this->file_;
        lVar6 = lVar6 + 0x38;
      } while (lVar5 < *(int *)(pFVar2 + 0x68));
      text = "}, ";
    }
  }
  io::Printer::Print(printer,text);
  if (*(int *)(this->file_ + 0x58) < 1) {
    io::Printer::Print(printer,"null));\n");
  }
  else {
    io::Printer::Print(printer,"new pbr::GeneratedClrTypeInfo[] {\n");
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    pFVar2 = this->file_;
    uVar3 = (ulong)*(uint *)(pFVar2 + 0x58);
    if (0 < (int)*(uint *)(pFVar2 + 0x58)) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        WriteGeneratedCodeInfo
                  (this,(Descriptor *)(*(long *)(pFVar2 + 0x60) + lVar5),printer,
                   uVar4 == (int)uVar3 - 1);
        uVar4 = uVar4 + 1;
        pFVar2 = this->file_;
        uVar3 = (ulong)*(int *)(pFVar2 + 0x58);
        lVar5 = lVar5 + 0xa8;
      } while ((long)uVar4 < (long)uVar3);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"\n}));\n");
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  io::Printer::Print(printer,"#endregion\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO(jonskeet): Consider a C#-escaping format here instead of just Base64.
  std::string base64 = FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
    // descriptor.proto is special: we don't allow access to the generated code, but there's
    // a separately-exposed property to get at the file descriptor, specifically to allow this
    // kind of dependency.
    if (IsDescriptorProto(file_->dependency(i))) {
      printer->Print("pbr::FileDescriptor.DescriptorProtoFileDescriptor, ");
    } else {
      printer->Print(
      "$full_reflection_class_name$.Descriptor, ",
      "full_reflection_class_name",
      GetReflectionClassName(file_->dependency(i)));
    }
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}